

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O2

void satoko_destroy(solver_t *s)

{
  cdb *__ptr;
  vec_wl_t *__ptr_00;
  watch_list *__ptr_01;
  void *__ptr_02;
  vec_act_t *__ptr_03;
  heap_t *__ptr_04;
  vec_int_t *__ptr_05;
  long lVar1;
  uint i;
  ulong uVar2;
  
  vec_uint_free(s->assumptions);
  vec_uint_free(s->final_conflict);
  __ptr = s->all_clauses;
  free(__ptr->data);
  free(__ptr);
  vec_uint_free(s->originals);
  vec_uint_free(s->learnts);
  __ptr_00 = s->watches;
  lVar1 = 0x10;
  for (uVar2 = 0; __ptr_01 = __ptr_00->watch_lists, uVar2 < __ptr_00->cap; uVar2 = uVar2 + 1) {
    __ptr_02 = *(void **)((long)&__ptr_01->cap + lVar1);
    if (__ptr_02 != (void *)0x0) {
      free(__ptr_02);
      *(undefined8 *)((long)&__ptr_01->cap + lVar1) = 0;
    }
    lVar1 = lVar1 + 0x18;
  }
  free(__ptr_01);
  free(__ptr_00);
  __ptr_03 = s->activity;
  free(__ptr_03->data);
  free(__ptr_03);
  __ptr_04 = s->var_order;
  __ptr_05 = __ptr_04->indices;
  free(__ptr_05->data);
  free(__ptr_05);
  vec_uint_free(__ptr_04->data);
  free(__ptr_04);
  vec_uint_free(s->levels);
  vec_uint_free(s->reasons);
  vec_char_free(s->assigns);
  vec_char_free(s->polarity);
  vec_uint_free(s->trail);
  vec_uint_free(s->trail_lim);
  b_queue_free(s->bq_lbd);
  b_queue_free(s->bq_trail);
  vec_uint_free(s->temp_lits);
  vec_char_free(s->seen);
  vec_uint_free(s->tagged);
  vec_uint_free(s->stack);
  vec_uint_free(s->last_dlevel);
  vec_uint_free(s->stamps);
  if (s->marks != (vec_char_t *)0x0) {
    vec_char_free(s->marks);
  }
  free(s);
  return;
}

Assistant:

void satoko_destroy(solver_t *s)
{
    vec_uint_free(s->assumptions);
    vec_uint_free(s->final_conflict);
    cdb_free(s->all_clauses);
    vec_uint_free(s->originals);
    vec_uint_free(s->learnts);
    vec_wl_free(s->watches);
    vec_act_free(s->activity);
    heap_free(s->var_order);
    vec_uint_free(s->levels);
    vec_uint_free(s->reasons);
    vec_char_free(s->assigns);
    vec_char_free(s->polarity);
    vec_uint_free(s->trail);
    vec_uint_free(s->trail_lim);
    b_queue_free(s->bq_lbd);
    b_queue_free(s->bq_trail);
    vec_uint_free(s->temp_lits);
    vec_char_free(s->seen);
    vec_uint_free(s->tagged);
    vec_uint_free(s->stack);
    vec_uint_free(s->last_dlevel);
    vec_uint_free(s->stamps);
    if (s->marks)
        vec_char_free(s->marks);
    satoko_free(s);
}